

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.cpp
# Opt level: O1

string * __thiscall
arangodb::velocypack::HexDump::toHex_abi_cxx11_
          (string *__return_storage_ptr__,HexDump *this,uint8_t value,string_view header)

{
  size_t sVar1;
  undefined7 in_register_00000011;
  
  sVar1 = header._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,sVar1,CONCAT71(in_register_00000011,value) + sVar1,
             sVar1,header._M_str);
  appendHex(__return_storage_ptr__,(uint8_t)this);
  return __return_storage_ptr__;
}

Assistant:

std::string HexDump::toHex(uint8_t value, std::string_view header) {
  std::string result(header);
  appendHex(result, value);
  return result;
}